

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

KindedSources * __thiscall
cmGeneratorTarget::GetKindedSources(cmGeneratorTarget *this,string *config)

{
  cmake *this_00;
  int iVar1;
  iterator iVar2;
  ostream *poVar3;
  KindedSources *files;
  cmListFileBacktrace cStack_1f8;
  string local_1d8;
  string key;
  ostringstream e;
  
  if (this->LinkImplementationLanguageIsContextDependent == false) {
    files = (KindedSources *)
            ((this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 2);
  }
  else {
    cmsys::SystemTools::UpperCase(&key,config);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>_>
            ::find(&(this->KindedSourcesMap)._M_t,&key);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &(this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header) {
      files = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>_>
              ::operator[](&this->KindedSourcesMap,&key);
      ComputeKindedSources(this,files,config);
      files->Initialized = true;
    }
    else if (*(char *)&iVar2._M_node[7]._M_parent == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,"The SOURCES of \"");
      poVar3 = std::operator<<(poVar3,(string *)&this->Target->Name);
      std::operator<<(poVar3,"\" use a generator expression that depends on the SOURCES themselves."
                     );
      this_00 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      GetBacktrace(&cStack_1f8,this);
      cmake::IssueMessage(this_00,FATAL_ERROR,&local_1d8,&cStack_1f8);
      cmListFileBacktrace::~cmListFileBacktrace(&cStack_1f8);
      std::__cxx11::string::~string((string *)&local_1d8);
      if (GetKindedSources(std::__cxx11::string_const&)::empty == '\0') {
        iVar1 = __cxa_guard_acquire(&GetKindedSources(std::__cxx11::string_const&)::empty);
        if (iVar1 != 0) {
          KindedSources::KindedSources(&GetKindedSources::empty);
          __cxa_atexit(KindedSources::~KindedSources,&GetKindedSources::empty,&__dso_handle);
          __cxa_guard_release(&GetKindedSources(std::__cxx11::string_const&)::empty);
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      files = &GetKindedSources::empty;
    }
    else {
      files = (KindedSources *)(iVar2._M_node + 2);
    }
    std::__cxx11::string::~string((string *)&key);
  }
  return files;
}

Assistant:

cmGeneratorTarget::KindedSources const& cmGeneratorTarget::GetKindedSources(
  std::string const& config) const
{
  // If we already processed one configuration and found no dependenc
  // on configuration then always use the one result.
  if (!this->LinkImplementationLanguageIsContextDependent) {
    return this->KindedSourcesMap.begin()->second;
  }

  // Lookup any existing link implementation for this configuration.
  std::string const key = cmSystemTools::UpperCase(config);
  KindedSourcesMapType::iterator it = this->KindedSourcesMap.find(key);
  if (it != this->KindedSourcesMap.end()) {
    if (!it->second.Initialized) {
      std::ostringstream e;
      e << "The SOURCES of \"" << this->GetName()
        << "\" use a generator expression that depends on the "
           "SOURCES themselves.";
      this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
        cmake::FATAL_ERROR, e.str(), this->GetBacktrace());
      static KindedSources empty;
      return empty;
    }
    return it->second;
  }

  // Add an entry to the map for this configuration.
  KindedSources& files = this->KindedSourcesMap[key];
  this->ComputeKindedSources(files, config);
  files.Initialized = true;
  return files;
}